

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_cipher.c
# Opt level: O3

int gost_grasshopper_cipher_do_cbc(EVP_CIPHER_CTX *ctx,uchar *out,uchar *in,size_t inl)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  grasshopper_w128_t *source;
  ulong uVar4;
  uint64_t uVar5;
  
  lVar3 = EVP_CIPHER_CTX_get_cipher_data();
  source = (grasshopper_w128_t *)EVP_CIPHER_CTX_iv_noconst(ctx);
  iVar2 = EVP_CIPHER_CTX_is_encrypting(ctx);
  if (0xf < inl) {
    uVar4 = inl >> 4;
    do {
      uVar1 = *(ulong *)in;
      if (iVar2 == 0) {
        uVar5 = *(uint64_t *)((long)in + 8);
        grasshopper_decrypt_block
                  ((grasshopper_round_keys_t *)(lVar3 + 0xe8),(grasshopper_w128_t *)in,
                   (grasshopper_w128_t *)out,(grasshopper_w128_t *)(lVar3 + 0x188));
        *(ulong *)out = *(ulong *)out ^ source->q[0];
        *(ulong *)((long)out + 8) = *(ulong *)((long)out + 8) ^ source->q[1];
        source->q[0] = uVar1;
      }
      else {
        source->q[0] = source->q[0] ^ uVar1;
        source->q[1] = source->q[1] ^ *(ulong *)((long)in + 8);
        grasshopper_encrypt_block
                  ((grasshopper_round_keys_t *)(lVar3 + 0x48),source,(grasshopper_w128_t *)out,
                   (grasshopper_w128_t *)(lVar3 + 0x188));
        source->q[0] = *(uint64_t *)out;
        uVar5 = *(uint64_t *)((long)out + 8);
      }
      source->q[1] = uVar5;
      in = (uchar *)((long)in + 0x10);
      out = (uchar *)((long)out + 0x10);
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  return 1;
}

Assistant:

static int gost_grasshopper_cipher_do_cbc(EVP_CIPHER_CTX *ctx, unsigned char *out,
                                          const unsigned char *in, size_t inl)
{
    gost_grasshopper_cipher_ctx *c =
        (gost_grasshopper_cipher_ctx *) EVP_CIPHER_CTX_get_cipher_data(ctx);
    unsigned char *iv = EVP_CIPHER_CTX_iv_noconst(ctx);
    bool encrypting = (bool) EVP_CIPHER_CTX_encrypting(ctx);
    const unsigned char *current_in = in;
    unsigned char *current_out = out;
    size_t blocks = inl / GRASSHOPPER_BLOCK_SIZE;
    size_t i;
    grasshopper_w128_t *currentBlock;

    currentBlock = (grasshopper_w128_t *) iv;

    for (i = 0; i < blocks;
         i++, current_in += GRASSHOPPER_BLOCK_SIZE, current_out +=
         GRASSHOPPER_BLOCK_SIZE) {
        grasshopper_w128_t *currentInputBlock = (grasshopper_w128_t *) current_in;
        grasshopper_w128_t *currentOutputBlock = (grasshopper_w128_t *) current_out;
        if (encrypting) {
            grasshopper_append128(currentBlock, currentInputBlock);
            grasshopper_encrypt_block(&c->encrypt_round_keys, currentBlock,
                                      currentOutputBlock, &c->buffer);
            grasshopper_copy128(currentBlock, currentOutputBlock);
        } else {
            grasshopper_w128_t tmp;

            grasshopper_copy128(&tmp, currentInputBlock);
            grasshopper_decrypt_block(&c->decrypt_round_keys,
                                      currentInputBlock, currentOutputBlock,
                                      &c->buffer);
            grasshopper_append128(currentOutputBlock, currentBlock);
            grasshopper_copy128(currentBlock, &tmp);
        }
    }

    return 1;
}